

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::install_level
          (Projection *this,int level,AmrLevel *level_data,
          Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
          *_radius)

{
  vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *this_00;
  Long LVar1;
  AmrLevel **ppAVar2;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  **ppVVar3;
  FabFactory<amrex::FArrayBox> *pFVar4;
  EBFArrayBoxFactory *this_01;
  EBFArrayBoxFactory **ppEVar5;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  AmrLevel *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  EBFArrayBoxFactory *_ebfactory;
  int finest_level;
  char (*in_stack_fffffffffffffde8) [28];
  AmrLevel *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe18;
  Print *in_stack_fffffffffffffe60;
  
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)&stack0xfffffffffffffe58,in_stack_fffffffffffffe18);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffde8);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffffdf0,*in_stack_fffffffffffffde8);
    amrex::Print::~Print(in_stack_fffffffffffffe60);
  }
  amrex::AmrMesh::finestLevel((AmrMesh *)*in_RDI);
  this_00 = (vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)(long)in_ESI;
  LVar1 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::size
                    ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)0x828423);
  if (LVar1 + -1 < (long)this_00) {
    std::vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::resize
              (this_00,in_stack_fffffffffffffe08);
    std::
    vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
    ::resize((vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
              *)this_00,in_stack_fffffffffffffe08);
  }
  ppAVar2 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
  *ppAVar2 = in_RDX;
  ppVVar3 = amrex::
            Vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
            ::operator[]((Vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
                          *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
  *ppVVar3 = in_RCX;
  amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
             in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
  pFVar4 = amrex::AmrLevel::Factory(in_stack_fffffffffffffdf0);
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast(pFVar4,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_01 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  ppEVar5 = amrex::
            Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            ::operator[]((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          *)this_01,(size_type)in_stack_fffffffffffffde8);
  *ppEVar5 = this_01;
  return;
}

Assistant:

void
Projection::install_level (int                     level,
                           AmrLevel*               level_data,
                           Vector< Vector<Real> >* _radius)
{
    if (verbose) amrex::Print() << "Installing projector level " << level << '\n';

    int finest_level = parent->finestLevel();

    if (level > LevelData.size() - 1)
    {
        LevelData.resize(finest_level+1);
        radius.resize(finest_level+1);
    }

    LevelData[level] = level_data;
    radius[level] = _radius;

#ifdef AMREX_USE_EB
    const auto& _ebfactory =
      dynamic_cast<EBFArrayBoxFactory const&>(LevelData[level]->Factory());
    ebfactory[level] = &_ebfactory;
#endif
}